

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O0

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::reset(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
        *this)

{
  element_type *peVar1;
  Logger *this_00;
  Chromosome *pCVar2;
  float local_14;
  GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
  *local_10;
  GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
  *this_local;
  
  local_10 = this;
  peVar1 = std::__shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>
                     );
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::initializePopulation(&this->_population,peVar1);
  peVar1 = std::__shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>
                     );
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::calculateFitness(&this->_population,peVar1);
  this_00 = getLogger();
  pCVar2 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::getFittestChromosome(&this->_population);
  local_14 = Chromosome<Gen,_ComputeFitness>::getFitness(pCVar2);
  pCVar2 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::getFittestChromosome(&this->_population);
  Logger::debug<char[9],float,char[15],crsGA::Chromosome<Gen,ComputeFitness>,char[2]>
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
             ,0x88,(char (*) [9])"Fitness=",&local_14,(char (*) [15])" Chromosome: {",pCVar2,
             (char (*) [2])"}");
  return;
}

Assistant:

void reset()
    {
        _population.initializePopulation(_data.get());
        _population.calculateFitness(_data.get());
        LOG_DEBUG("Fitness=", _population.getFittestChromosome().getFitness(), " Chromosome: {", _population.getFittestChromosome(), "}");
    }